

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota_lessor.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  plan(3);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  test_basic();
  test_hard_lease();
  test_leases_on_destroy();
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main()
{
	plan(3);
	header();

	test_basic();
	test_hard_lease();
	test_leases_on_destroy();

	footer();
	return check_plan();
}